

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchingEngine.cpp
# Opt level: O3

void __thiscall MatchingEngine::displayBuyQueue(MatchingEngine *this)

{
  _Elt_pointer pOVar1;
  ostream *os;
  _Map_pointer ppOVar2;
  MatchingEngine *this_00;
  _Elt_pointer pOVar3;
  _Elt_pointer this_01;
  _Map_pointer local_50;
  _Elt_pointer local_40;
  
  if (this->m_logStreamType == consoleStream) {
    os = (ostream *)&std::cout;
  }
  else {
    os = (ostream *)&this->m_outputFileStream;
  }
  this_01 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pOVar1 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (this_01 != pOVar1) {
    pOVar3 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppOVar2 = (this->m_BuyOrderQueue).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    do {
      this_00 = (MatchingEngine *)&stack0xffffffffffffffb0;
      Order::getOrderDetails_abi_cxx11_((string *)&stack0xffffffffffffffb0,this_01);
      writeToStream(this_00,(string *)&stack0xffffffffffffffb0,os);
      if (local_50 != &stack0xffffffffffffffc0) {
        operator_delete(local_50,(ulong)((long)&local_40->m_seqId + 1));
      }
      this_01 = this_01 + 1;
      if (this_01 == pOVar3) {
        this_01 = ppOVar2[1];
        ppOVar2 = ppOVar2 + 1;
        pOVar3 = this_01 + 0xc;
      }
    } while (this_01 != pOVar1);
  }
  return;
}

Assistant:

std::ostream& MatchingEngine::getStreamRef()
{
	if(getoutputStreamType() == outputStreamType::consoleStream)
		return(std::cout);
	else
		return(m_outputFileStream);
}